

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_Test::testBody
          (TEST_PluginTest_DisablesPluginsDontRun_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_PluginTest_DisablesPluginsDontRun_Test *local_10;
  TEST_PluginTest_DisablesPluginsDontRun_Test *this_local;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  local_10 = this;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
    _vptr_TestPlugin[0xc])();
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
            _vptr_TestPlugin[0xe])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((byte)((byte)iVar2 ^ 0xff) & 1),"CHECK","!thirdPlugin->isEnabled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0xb2,pTVar5);
  (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
    _vptr_TestPlugin[0xd])();
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
               field_0x24 == 2) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb5,pTVar5);
  }
  else {
    if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
                 field_0x24 !=
        *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin).
                 field_0x24) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0xb5);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom((int)&local_20);
    pcVar6 = SimpleString::asCharString(&local_20);
    StringFrom((int)local_40);
    pcVar7 = SimpleString::asCharString(local_40);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb5,pTVar5);
    SimpleString::~SimpleString(local_40);
    SimpleString::~SimpleString(&local_20);
  }
  if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
               field_0x24 == 1) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb6,pTVar5);
  }
  else {
    if (*(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
                 field_0x24 !=
        *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
                 field_0x24) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0xb6);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom((int)&local_50);
    pcVar6 = SimpleString::asCharString(&local_50);
    StringFrom((int)&local_60);
    pcVar7 = SimpleString::asCharString(&local_60);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb6,pTVar5);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString(&local_50);
  }
  pUVar4 = UtestShell::getCurrent();
  uVar3 = (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
            _vptr_TestPlugin[0xe])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 1),"CHECK","thirdPlugin->isEnabled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0xb7,pTVar5);
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}